

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O1

void testing::Mock::UnregisterCallReaction(uintptr_t mock_obj)

{
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_testing::internal::CallReaction>,_std::allocator<std::pair<const_unsigned_long,_testing::internal::CallReaction>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var1;
  
  internal::MutexBase::Lock((MutexBase *)internal::g_gmock_mutex);
  p_Var1 = &anon_unknown_6::UninterestingCallReactionMap()->_M_h;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_testing::internal::CallReaction>,_std::allocator<std::pair<const_unsigned_long,_testing::internal::CallReaction>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(p_Var1);
  internal::MutexBase::Unlock((MutexBase *)internal::g_gmock_mutex);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  UninterestingCallReactionMap().erase(static_cast<uintptr_t>(mock_obj));
}